

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UpnpFileInfo.c
# Opt level: O1

UpnpFileInfo * UpnpFileInfo_new(void)

{
  UpnpFileInfo *pUVar1;
  UpnpString *pUVar2;
  
  pUVar1 = (UpnpFileInfo *)calloc(1,0xb8);
  if (pUVar1 == (UpnpFileInfo *)0x0) {
    pUVar1 = (UpnpFileInfo *)0x0;
  }
  else {
    UpnpListInit(&pUVar1->m_ExtraHeadersList);
    pUVar2 = UpnpString_new();
    pUVar1->m_Os = pUVar2;
  }
  return pUVar1;
}

Assistant:

UpnpFileInfo *UpnpFileInfo_new(void)
{
	struct s_UpnpFileInfo *p = calloc(1, sizeof(struct s_UpnpFileInfo));

	if (!p)
		return 0;

	/*p->m_FileLength = 0;*/
	/*p->m_LastModified = 0;*/
	/*p->m_IsDirectory = 0;*/
	/*p->m_IsReadable = 0;*/
	/*p->m_ContentType = 0;*/
	UpnpListInit(&p->m_ExtraHeadersList);
	/* memset(&p->m_CtrlPtIPAddr, 0, sizeof (struct sockaddr_storage)); */
	p->m_Os = UpnpString_new();

	return (UpnpFileInfo *)p;
}